

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void Curl_multi_process_pending_handles(Curl_multi *multi)

{
  Curl_easy *data_00;
  Curl_easy *pCVar1;
  curl_llist_element *next;
  Curl_easy *data;
  curl_llist_element *e;
  Curl_multi *multi_local;
  
  pCVar1 = (Curl_easy *)(multi->pending).head;
  while (data = pCVar1, data != (Curl_easy *)0x0) {
    data_00 = data->next;
    pCVar1 = (Curl_easy *)data->easy_conn;
    if (data_00->mstate == CURLM_STATE_CONNECT_PEND) {
      mstate(data_00,CURLM_STATE_CONNECT);
      Curl_llist_remove(&multi->pending,(curl_llist_element *)data,(void *)0x0);
      Curl_expire(data_00,0,EXPIRE_RUN_NOW);
    }
  }
  return;
}

Assistant:

void Curl_multi_process_pending_handles(struct Curl_multi *multi)
{
  struct curl_llist_element *e = multi->pending.head;

  while(e) {
    struct Curl_easy *data = e->ptr;
    struct curl_llist_element *next = e->next;

    if(data->mstate == CURLM_STATE_CONNECT_PEND) {
      multistate(data, CURLM_STATE_CONNECT);

      /* Remove this node from the list */
      Curl_llist_remove(&multi->pending, e, NULL);

      /* Make sure that the handle will be processed soonish. */
      Curl_expire(data, 0, EXPIRE_RUN_NOW);
    }

    e = next; /* operate on next handle */
  }
}